

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

int __thiscall iDynTree::BerdyHelper::init(BerdyHelper *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  SensorsList *this_00;
  long in_RCX;
  SensorsList *in_RDX;
  Model modelCopy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  long *local_178 [2];
  long local_168 [2];
  Model local_158 [304];
  
  iDynTree::Model::Model(local_158,(Model *)ctx);
  this_00 = (SensorsList *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=(this_00,in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_190,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RCX + 0x10));
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_178,*(long *)(in_RCX + 0x28),
             *(long *)(in_RCX + 0x30) + *(long *)(in_RCX + 0x28));
  iVar1 = init(this,(EVP_PKEY_CTX *)local_158);
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  iDynTree::Model::~Model(local_158);
  return iVar1;
}

Assistant:

bool BerdyHelper::init(const Model& model,
                       const SensorsList& sensors,
                       const BerdyOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}